

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create.cpp
# Opt level: O3

LogicalType * __thiscall
duckdb::Binder::BindLogicalTypeInternal
          (LogicalType *__return_storage_ptr__,Binder *this,LogicalType *type,
          optional_ptr<duckdb::Catalog,_true> catalog,string *schema)

{
  pointer pcVar1;
  element_type *peVar2;
  pointer pLVar3;
  optional_ptr<duckdb::Catalog,_true> catalog_00;
  optional_ptr<duckdb::CatalogEntry,_true> oVar4;
  element_type *peVar5;
  size_type sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
  this_00;
  bool bVar10;
  string *psVar11;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *__x;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *__x_00;
  LogicalType *pLVar12;
  idx_t iVar13;
  vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *this_01;
  BinderException *this_02;
  _Alloc_hider __args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  ulong index;
  EntryLookupInfo *this_03;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  LogicalType *result;
  string type_catalog;
  string user_type_schema;
  string user_type_name;
  EntryLookupInfo type_lookup;
  string type_schema;
  vector<duckdb::Value,_true> user_type_mods;
  optional_ptr<duckdb::Catalog,_true> local_1c0;
  optional_ptr<duckdb::CatalogEntry,_true> local_1b8;
  element_type *local_1b0;
  undefined1 local_1a8 [16];
  undefined1 auStack_198 [16];
  string local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_158;
  EntryLookupInfo local_148;
  unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
  local_120;
  string local_118;
  undefined1 local_f8 [24];
  optional_idx local_e0;
  element_type *local_d8;
  tuple<duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_> tStack_d0;
  optional_ptr<duckdb::CatalogEntry,_true> local_c8;
  undefined1 local_b8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  LogicalType local_60;
  LogicalType local_48;
  
  local_1c0.ptr = catalog.ptr;
  local_1b0 = (element_type *)__return_storage_ptr__;
  if (type->id_ == USER) {
    psVar11 = UserType::GetTypeName_abi_cxx11_(type);
    local_168._M_allocated_capacity = (size_type)&aStack_158;
    pcVar1 = (psVar11->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,pcVar1,pcVar1 + psVar11->_M_string_length);
    psVar11 = UserType::GetSchema_abi_cxx11_(type);
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    pcVar1 = (psVar11->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(auStack_198 + 0x10),pcVar1,pcVar1 + psVar11->_M_string_length);
    __x = &UserType::GetTypeModifiers(type)->
           super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>;
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_f8,__x);
    LogicalType::LogicalType((LogicalType *)local_1b0);
    EntryLookupInfo::EntryLookupInfo
              (&local_148,TYPE_ENTRY,(string *)&local_168,(QueryErrorContext)0xffffffffffffffff);
    if (local_1c0.ptr == (Catalog *)0x0) {
      psVar11 = UserType::GetCatalog_abi_cxx11_(type);
      pcVar1 = (psVar11->_M_dataplus)._M_p;
      local_1a8._0_8_ = (ClientContext *)auStack_198;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,pcVar1,pcVar1 + psVar11->_M_string_length);
      psVar11 = UserType::GetSchema_abi_cxx11_(type);
      pcVar1 = (psVar11->_M_dataplus)._M_p;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,pcVar1,pcVar1 + psVar11->_M_string_length);
      BindSchemaOrCatalog(this->context,(string *)local_1a8,&local_118);
      local_1b8 = CatalogEntryRetriever::GetEntry
                            (&this->entry_retriever,(string *)local_1a8,&local_118,&local_148,
                             THROW_EXCEPTION);
      optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_1b8);
      oVar4.ptr = local_1b8.ptr;
      if ((element_type *)&local_1b8.ptr[1].timestamp != local_1b0) {
        *(LogicalTypeId *)&local_1b0->_vptr_ExtraTypeInfo =
             (LogicalTypeId)local_1b8.ptr[1].timestamp.super___atomic_base<unsigned_long>._M_i;
        *(PhysicalType *)((long)&local_1b0->_vptr_ExtraTypeInfo + 1) =
             *(PhysicalType *)
              ((long)&local_1b8.ptr[1].timestamp.super___atomic_base<unsigned_long>._M_i + 1);
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)&local_1b0->type,
                   (shared_ptr<duckdb::ExtraTypeInfo,_true> *)&local_1b8.ptr[1].comment);
      }
      p_Var14 = oVar4.ptr[1].comment.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((ClientContext *)local_1a8._0_8_ != (ClientContext *)auStack_198) {
        operator_delete((void *)local_1a8._0_8_);
      }
      goto LAB_011bc10d;
    }
    local_1b8.ptr = (CatalogEntry *)0x0;
    if ((CatalogSet *)local_188._M_string_length == (CatalogSet *)0x0) {
LAB_011bbe52:
      optional_ptr<duckdb::Catalog,_true>::CheckValid(&local_1c0);
      local_1b8 = CatalogEntryRetriever::GetEntry
                            (&this->entry_retriever,local_1c0.ptr,schema,&local_148,RETURN_NULL);
    }
    else {
      optional_ptr<duckdb::Catalog,_true>::CheckValid(&local_1c0);
      local_1b8 = CatalogEntryRetriever::GetEntry
                            (&this->entry_retriever,local_1c0.ptr,(string *)(auStack_198 + 0x10),
                             &local_148,RETURN_NULL);
      local_1a8._0_8_ = local_1b8;
      if ((local_1b8.ptr == (CatalogEntry *)0x0) ||
         (optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
                    ((optional_ptr<duckdb::CatalogEntry,_true> *)local_1a8),
         (char)(((atomic<unsigned_long> *)(local_1a8._0_8_ + 0x120))->
               super___atomic_base<unsigned_long>)._M_i == '\0')) goto LAB_011bbe52;
    }
    local_1a8._0_8_ = local_1b8.ptr;
    if (((ClientContext *)local_1b8.ptr == (ClientContext *)0x0) ||
       (optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
                  ((optional_ptr<duckdb::CatalogEntry,_true> *)local_1a8),
       (char)(((atomic<unsigned_long> *)(local_1a8._0_8_ + 0x120))->
             super___atomic_base<unsigned_long>)._M_i == '\0')) {
      optional_ptr<duckdb::Catalog,_true>::CheckValid(&local_1c0);
      catalog_00.ptr = local_1c0.ptr;
      local_1a8._0_8_ = (CatalogEntry *)auStack_198;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,anon_var_dwarf_6372561 + 9);
      local_1b8 = CatalogEntryRetriever::GetEntry
                            (&this->entry_retriever,catalog_00.ptr,(string *)local_1a8,&local_148,
                             RETURN_NULL);
      if ((CatalogEntry *)local_1a8._0_8_ != (CatalogEntry *)auStack_198) {
        operator_delete((void *)local_1a8._0_8_);
      }
    }
    local_1a8._0_8_ = local_1b8.ptr;
    if (((ClientContext *)local_1b8.ptr == (ClientContext *)0x0) ||
       (optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
                  ((optional_ptr<duckdb::CatalogEntry,_true> *)local_1a8),
       (char)(((atomic<unsigned_long> *)(local_1a8._0_8_ + 0x120))->
             super___atomic_base<unsigned_long>)._M_i == '\0')) {
      local_1a8._0_8_ = (ClientContext *)auStack_198;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,anon_var_dwarf_6372561 + 9);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,anon_var_dwarf_6372561 + 9);
      local_1b8 = CatalogEntryRetriever::GetEntry
                            (&this->entry_retriever,(string *)local_1a8,&local_118,&local_148,
                             THROW_EXCEPTION);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((ClientContext *)local_1a8._0_8_ != (ClientContext *)auStack_198) {
        operator_delete((void *)local_1a8._0_8_);
      }
    }
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_1b8);
    oVar4.ptr = local_1b8.ptr;
    if ((element_type *)&local_1b8.ptr[1].timestamp != local_1b0) {
      *(LogicalTypeId *)&local_1b0->_vptr_ExtraTypeInfo =
           (LogicalTypeId)local_1b8.ptr[1].timestamp.super___atomic_base<unsigned_long>._M_i;
      *(PhysicalType *)((long)&local_1b0->_vptr_ExtraTypeInfo + 1) =
           *(PhysicalType *)
            ((long)&local_1b8.ptr[1].timestamp.super___atomic_base<unsigned_long>._M_i + 1);
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)&local_1b0->type,
                 (shared_ptr<duckdb::ExtraTypeInfo,_true> *)&local_1b8.ptr[1].comment);
    }
    p_Var14 = oVar4.ptr[1].comment.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
LAB_011bc10d:
    BindLogicalType(this,(LogicalType *)local_1b0,local_1c0,schema);
    peVar5 = local_1b0;
    if (p_Var14 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (local_f8._0_8_ != local_f8._8_8_) {
        this_02 = (BinderException *)__cxa_allocate_exception(0x10);
        local_1a8._0_8_ = auStack_198;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"Type \'%s\' does not take any type modifiers","");
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_b8 + 0x18),local_168._M_allocated_capacity,
                   local_168._8_8_ + local_168._M_allocated_capacity);
        BinderException::BinderException<std::__cxx11::string>
                  (this_02,(string *)local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b8 + 0x18));
        __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_1a8._0_8_ = this->context;
      local_1a8._8_8_ = local_1b0;
      auStack_198._0_8_ = local_f8;
      (*(code *)p_Var14)(&local_118);
      *(LogicalTypeId *)&peVar5->_vptr_ExtraTypeInfo = (LogicalTypeId)local_118._M_dataplus._M_p;
      *(PhysicalType *)((long)&peVar5->_vptr_ExtraTypeInfo + 1) = local_118._M_dataplus._M_p._1_1_;
      peVar2 = (((shared_ptr<duckdb::ExtraTypeInfo,_true> *)&peVar5->type)->internal).
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(peVar5->alias)._M_dataplus._M_p;
      (((shared_ptr<duckdb::ExtraTypeInfo,_true> *)&peVar5->type)->internal).
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_118._M_string_length;
      (peVar5->alias)._M_dataplus._M_p = (pointer)local_118.field_2._M_allocated_capacity;
      local_118._M_string_length = (size_type)peVar2;
      local_118.field_2._M_allocated_capacity = (size_type)p_Var14;
      LogicalType::~LogicalType((LogicalType *)&local_118);
    }
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_allocated_capacity == &aStack_158) {
      return (LogicalType *)local_1b0;
    }
    operator_delete((void *)local_168._M_allocated_capacity);
    return (LogicalType *)local_1b0;
  }
  LogicalType::LogicalType((LogicalType *)&local_168);
  switch(type->id_) {
  case STRUCT:
    __x_00 = &StructType::GetChildTypes_abi_cxx11_(type)->
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)(auStack_198 + 0x10),__x_00);
    sVar6 = local_188._M_string_length;
    local_148.catalog_type = INVALID;
    local_148._1_7_ = 0;
    local_148.name = (string *)0x0;
    local_148.at_clause.ptr = (BoundAtClause *)0x0;
    if (local_188._M_dataplus._M_p == (pointer)local_188._M_string_length) {
      local_b8._16_8_ = (BoundAtClause *)0x0;
      local_b8[0] = INVALID;
      local_b8._1_3_ = 0;
      local_b8._4_4_ = 0;
      local_b8[8] = false;
      local_b8[9] = false;
      local_b8[10] = QUERY_TREE;
      local_b8[0xb] = 0;
      local_b8._12_4_ = 0;
    }
    else {
      __args._M_p = local_188._M_dataplus._M_p;
      do {
        BindLogicalTypeInternal
                  ((LogicalType *)local_1a8,this,
                   (LogicalType *)
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&((element_type *)__args._M_p)->config + 1),local_1c0,schema);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::__cxx11::string&,duckdb::LogicalType>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args._M_p,
                   (LogicalType *)local_1a8);
        LogicalType::~LogicalType((LogicalType *)local_1a8);
        __args._M_p = (pointer)((long)&((element_type *)__args._M_p)->config + 0x28);
      } while (__args._M_p != (pointer)sVar6);
      local_b8._16_8_ = local_148.at_clause.ptr;
      local_b8._0_4_ = local_148._0_4_;
      local_b8._4_4_ = local_148._4_4_;
      local_b8._8_4_ = local_148.name._0_4_;
      local_b8._12_4_ = local_148.name._4_4_;
    }
    local_148._0_8_ = (ExtensionTypeInfo *)0x0;
    local_148.name = (string *)0x0;
    local_148.at_clause.ptr = (BoundAtClause *)0x0;
    LogicalType::STRUCT((LogicalType *)local_1a8,(child_list_t<LogicalType> *)local_b8);
    uVar8 = aStack_158._M_allocated_capacity;
    uVar7 = local_168._8_8_;
    local_168._M_allocated_capacity._0_2_ = local_1a8._0_2_;
    local_168._8_8_ = local_1a8._8_8_;
    aStack_158._M_allocated_capacity = auStack_198._0_8_;
    local_1a8._8_8_ = uVar7;
    auStack_198._0_8_ = uVar8;
    LogicalType::~LogicalType((LogicalType *)local_1a8);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)local_b8);
    this_03 = &local_148;
    break;
  case LIST:
    pLVar12 = ListType::GetChildType(type);
    BindLogicalTypeInternal((LogicalType *)(auStack_198 + 0x10),this,pLVar12,local_1c0,schema);
    LogicalType::LIST((LogicalType *)&local_148,(LogicalType *)(auStack_198 + 0x10));
    goto LAB_011bc3af;
  case MAP:
    pLVar12 = MapType::KeyType(type);
    BindLogicalTypeInternal((LogicalType *)(auStack_198 + 0x10),this,pLVar12,local_1c0,schema);
    pLVar12 = MapType::ValueType(type);
    BindLogicalTypeInternal((LogicalType *)&local_148,this,pLVar12,local_1c0,schema);
    LogicalType::LogicalType(&local_48,(LogicalType *)(auStack_198 + 0x10));
    LogicalType::LogicalType(&local_60,(LogicalType *)&local_148);
    LogicalType::MAP((LogicalType *)local_1a8,&local_48,&local_60);
    uVar8 = aStack_158._M_allocated_capacity;
    uVar7 = local_168._8_8_;
    local_168._M_allocated_capacity._0_2_ = local_1a8._0_2_;
    local_168._8_8_ = local_1a8._8_8_;
    aStack_158._M_allocated_capacity = auStack_198._0_8_;
    local_1a8._8_8_ = uVar7;
    auStack_198._0_8_ = uVar8;
    LogicalType::~LogicalType((LogicalType *)local_1a8);
    LogicalType::~LogicalType(&local_60);
    LogicalType::~LogicalType(&local_48);
    goto LAB_011bc3d1;
  default:
    LogicalType::LogicalType((LogicalType *)local_1b0,type);
    goto LAB_011bc5dc;
  case UNION:
    local_188._M_dataplus._M_p = (pointer)0x0;
    local_188._M_string_length = 0;
    local_188.field_2._M_allocated_capacity = 0;
    for (index = 0; iVar13 = UnionType::GetMemberCount(type), index < iVar13; index = index + 1) {
      pLVar12 = UnionType::GetMemberType(type,index);
      BindLogicalTypeInternal((LogicalType *)&local_148,this,pLVar12,local_1c0,schema);
      psVar11 = UnionType::GetMemberName_abi_cxx11_(type,index);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
      ::emplace_back<std::__cxx11::string_const&,duckdb::LogicalType>
                ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                  *)(auStack_198 + 0x10),psVar11,(LogicalType *)&local_148);
      LogicalType::~LogicalType((LogicalType *)&local_148);
    }
    local_d8 = (element_type *)local_188._M_dataplus._M_p;
    tStack_d0.
    super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
    super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)
         (_Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)
         local_188._M_string_length;
    local_c8.ptr = (CatalogEntry *)local_188.field_2._M_allocated_capacity;
    local_188._M_dataplus._M_p = (pointer)0x0;
    local_188._M_string_length = 0;
    local_188.field_2._M_allocated_capacity = 0;
    LogicalType::UNION((LogicalType *)&local_148,(child_list_t<LogicalType> *)&local_d8);
    uVar9 = local_148._0_8_;
    uVar8 = aStack_158._M_allocated_capacity;
    uVar7 = local_168._8_8_;
    local_168._M_local_buf[0] = local_148.catalog_type;
    local_168._M_local_buf[1] = local_148._1_1_;
    local_168._8_8_ = local_148.name;
    aStack_158._M_allocated_capacity = (size_type)local_148.at_clause.ptr;
    local_148.name = (string *)uVar7;
    local_148.at_clause.ptr = (BoundAtClause *)uVar8;
    local_148._0_8_ = uVar9;
    LogicalType::~LogicalType((LogicalType *)&local_148);
    this_03 = (EntryLookupInfo *)&local_d8;
    break;
  case ARRAY:
    pLVar12 = ArrayType::GetChildType(type);
    BindLogicalTypeInternal((LogicalType *)(auStack_198 + 0x10),this,pLVar12,local_1c0,schema);
    iVar13 = ArrayType::GetSize(type);
    optional_idx::optional_idx(&local_e0,iVar13);
    LogicalType::ARRAY((LogicalType *)&local_148,(LogicalType *)(auStack_198 + 0x10),local_e0);
LAB_011bc3af:
    uVar9 = local_148._0_8_;
    uVar8 = aStack_158._M_allocated_capacity;
    uVar7 = local_168._8_8_;
    local_168._M_local_buf[0] = local_148.catalog_type;
    local_168._M_local_buf[1] = local_148._1_1_;
    local_168._8_8_ = local_148.name;
    aStack_158._M_allocated_capacity = (size_type)local_148.at_clause.ptr;
    local_148.name = (string *)uVar7;
    local_148.at_clause.ptr = (BoundAtClause *)uVar8;
    local_148._0_8_ = uVar9;
LAB_011bc3d1:
    LogicalType::~LogicalType((LogicalType *)&local_148);
    LogicalType::~LogicalType((LogicalType *)(auStack_198 + 0x10));
    goto LAB_011bc4c7;
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)this_03);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)(auStack_198 + 0x10));
LAB_011bc4c7:
  LogicalType::GetAlias_abi_cxx11_(&local_80,type);
  LogicalType::SetAlias((LogicalType *)&local_168,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  bVar10 = LogicalType::HasExtensionInfo(type);
  if (bVar10) {
    local_148._0_8_ = LogicalType::GetExtensionInfo(type);
    optional_ptr<const_duckdb::ExtensionTypeInfo,_true>::CheckValid
              ((optional_ptr<const_duckdb::ExtensionTypeInfo,_true> *)&local_148);
    uVar7 = local_148._0_8_;
    this_01 = (vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
              operator_new(0x50);
    std::vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>::vector
              (this_01,(vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                        *)uVar7);
    local_188._M_dataplus._M_p = (pointer)(this_01 + 1);
    this_01[1].
    super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    this_01[1].
    super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>.
    _M_impl.super__Vector_impl_data._M_finish = *(pointer *)(uVar7 + 0x20);
    this_01[1].
    super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_01[2].
    super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>.
    _M_impl.super__Vector_impl_data._M_start = *(pointer *)(uVar7 + 0x30);
    pLVar3 = *(pointer *)(uVar7 + 0x40);
    this_01[2].
    super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>.
    _M_impl.super__Vector_impl_data._M_finish = *(pointer *)(uVar7 + 0x38);
    this_01[2].
    super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = pLVar3;
    this_01[3].
    super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::Value>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)local_188._M_dataplus._M_p,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(uVar7 + 0x18),
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
                *)(auStack_198 + 0x10));
  }
  else {
    this_01 = (vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
              0x0;
  }
  local_120.
  super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>)
       (unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>)
       this_01;
  LogicalType::SetExtensionInfo((LogicalType *)&local_168,&local_120);
  this_00.
  super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>)
       (unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>)
       local_120;
  if (local_120.
      super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
      .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true,_true>
       )0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)((long)local_120.
                            super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                            .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl
                     + 0x18));
    std::vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>::~vector
              ((vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
               this_00.
               super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
               .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl);
    operator_delete((void *)this_00.
                            super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                            .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl)
    ;
  }
  local_120.
  super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>)
       (__uniq_ptr_data<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true,_true>
        )0x0;
  LogicalType::LogicalType((LogicalType *)local_1b0,(LogicalType *)&local_168);
LAB_011bc5dc:
  LogicalType::~LogicalType((LogicalType *)&local_168);
  return (LogicalType *)local_1b0;
}

Assistant:

LogicalType Binder::BindLogicalTypeInternal(const LogicalType &type, optional_ptr<Catalog> catalog,
                                            const string &schema) {
	if (type.id() != LogicalTypeId::USER) {
		// Nested type, make sure to bind any nested user types recursively
		LogicalType result;
		switch (type.id()) {
		case LogicalTypeId::LIST: {
			auto child_type = BindLogicalTypeInternal(ListType::GetChildType(type), catalog, schema);
			result = LogicalType::LIST(child_type);
			break;
		}
		case LogicalTypeId::MAP: {
			auto key_type = BindLogicalTypeInternal(MapType::KeyType(type), catalog, schema);
			auto value_type = BindLogicalTypeInternal(MapType::ValueType(type), catalog, schema);
			result = LogicalType::MAP(std::move(key_type), std::move(value_type));
			break;
		}
		case LogicalTypeId::ARRAY: {
			auto child_type = BindLogicalTypeInternal(ArrayType::GetChildType(type), catalog, schema);
			auto array_size = ArrayType::GetSize(type);
			result = LogicalType::ARRAY(child_type, array_size);
			break;
		}
		case LogicalTypeId::STRUCT: {
			auto child_types = StructType::GetChildTypes(type);
			child_list_t<LogicalType> new_child_types;
			for (auto &entry : child_types) {
				new_child_types.emplace_back(entry.first, BindLogicalTypeInternal(entry.second, catalog, schema));
			}
			result = LogicalType::STRUCT(std::move(new_child_types));
			break;
		}
		case LogicalTypeId::UNION: {
			child_list_t<LogicalType> member_types;
			for (idx_t i = 0; i < UnionType::GetMemberCount(type); i++) {
				auto child_type = BindLogicalTypeInternal(UnionType::GetMemberType(type, i), catalog, schema);
				member_types.emplace_back(UnionType::GetMemberName(type, i), std::move(child_type));
			}
			result = LogicalType::UNION(std::move(member_types));
			break;
		}
		default:
			return type;
		}

		// Set the alias and extension info back
		result.SetAlias(type.GetAlias());
		auto ext_info = type.HasExtensionInfo() ? make_uniq<ExtensionTypeInfo>(*type.GetExtensionInfo()) : nullptr;
		result.SetExtensionInfo(std::move(ext_info));
		return result;
	}

	// User type, bind the user type
	auto user_type_name = UserType::GetTypeName(type);
	auto user_type_schema = UserType::GetSchema(type);
	auto user_type_mods = UserType::GetTypeModifiers(type);

	bind_logical_type_function_t user_bind_modifiers_func = nullptr;

	LogicalType result;
	EntryLookupInfo type_lookup(CatalogType::TYPE_ENTRY, user_type_name);
	if (catalog) {
		// The search order is:
		// 1) In the explicitly set schema (my_schema.my_type)
		// 2) In the same schema as the table
		// 3) In the same catalog
		// 4) System catalog

		optional_ptr<CatalogEntry> entry = nullptr;
		if (!user_type_schema.empty()) {
			entry = entry_retriever.GetEntry(*catalog, user_type_schema, type_lookup, OnEntryNotFound::RETURN_NULL);
		}
		if (!IsValidUserType(entry)) {
			entry = entry_retriever.GetEntry(*catalog, schema, type_lookup, OnEntryNotFound::RETURN_NULL);
		}
		if (!IsValidUserType(entry)) {
			entry = entry_retriever.GetEntry(*catalog, INVALID_SCHEMA, type_lookup, OnEntryNotFound::RETURN_NULL);
		}
		if (!IsValidUserType(entry)) {
			entry = entry_retriever.GetEntry(INVALID_CATALOG, INVALID_SCHEMA, type_lookup,
			                                 OnEntryNotFound::THROW_EXCEPTION);
		}
		auto &type_entry = entry->Cast<TypeCatalogEntry>();
		result = type_entry.user_type;
		user_bind_modifiers_func = type_entry.bind_function;
	} else {
		string type_catalog = UserType::GetCatalog(type);
		string type_schema = UserType::GetSchema(type);

		BindSchemaOrCatalog(context, type_catalog, type_schema);
		auto entry = entry_retriever.GetEntry(type_catalog, type_schema, type_lookup);
		auto &type_entry = entry->Cast<TypeCatalogEntry>();
		result = type_entry.user_type;
		user_bind_modifiers_func = type_entry.bind_function;
	}

	// Now we bind the inner user type
	BindLogicalType(result, catalog, schema);

	// Apply the type modifiers (if any)
	if (user_bind_modifiers_func) {
		// If an explicit bind_modifiers function was provided, use that to construct the type

		BindLogicalTypeInput input {context, result, user_type_mods};
		result = user_bind_modifiers_func(input);
	} else {
		if (!user_type_mods.empty()) {
			throw BinderException("Type '%s' does not take any type modifiers", user_type_name);
		}
	}
	return result;
}